

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

array<cv::Mat,_10UL> *
compute_target_ring_mask
          (array<cv::Mat,_10UL> *__return_storage_ptr__,
          array<cv::RotatedRect,_10UL> *target_ellipses,int img_row,int img_col,bool debug)

{
  float *pfVar1;
  array<cv::Mat,_10UL> *this;
  long lVar2;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__s;
  __m128 t;
  _InputOutputArray local_318;
  _InputArray local_300;
  int local_2e8;
  int local_2e4;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_288 [15];
  array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL> target_contours;
  
  __s = target_contours._M_elems;
  memset(__s,0,0xf0);
  for (lVar2 = 0xc; lVar2 != 0xd4; lVar2 = lVar2 + 0x14) {
    local_288[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8 = (int)ROUND(*(float *)((long)target_ellipses->_M_elems + lVar2 + -0xc));
    pfVar1 = (float *)((long)target_ellipses->_M_elems + lVar2 + -8);
    local_2e4 = (int)ROUND(*pfVar1);
    local_318.super__OutputArray.super__InputArray.flags =
         (int)ROUND(*(float *)((long)target_ellipses->_M_elems + lVar2 + -4) * 0.5);
    local_318.super__OutputArray.super__InputArray._4_4_ =
         (BADTYPE)ROUND(*(float *)((long)&target_ellipses->_M_elems[0].center.x + lVar2) * 0.5);
    cv::ellipse2Poly((MatExpr *)&local_2e8,&local_318,(int)pfVar1[3],0,0x168,1,local_288);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::_M_move_assign(__s,local_288);
    std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base(local_288);
    __s = __s + 1;
  }
  std::array<cv::Mat,_10UL>::array(__return_storage_ptr__);
  this = __return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 0x18) {
    cv::Mat::zeros((int)(MatExpr *)local_288,img_row,img_col);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&local_2e8);
    cv::MatExpr::~MatExpr((MatExpr *)local_288);
    local_318.super__OutputArray.super__InputArray.sz.width = 0;
    local_318.super__OutputArray.super__InputArray.sz.height = 0;
    local_300.sz.width = 0;
    local_300.sz.height = 0;
    local_318.super__OutputArray.super__InputArray.flags = 0x3010000;
    local_300.flags = -0x7efcfff4;
    local_318.super__OutputArray.super__InputArray.obj = (MatExpr *)&local_2e8;
    local_300.obj =
         (void *)((long)&target_contours._M_elems[0].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_288,255.0);
    cv::fillConvexPoly(&local_318,&local_300,(Scalar_ *)local_288,8,0);
    cv::Mat::operator=((Mat *)this,(Mat *)&local_2e8);
    cv::Mat::~Mat((Mat *)&local_2e8);
    this = (array<cv::Mat,_10UL> *)&this->field_0x60;
  }
  std::array<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_10UL>::~array
            (&target_contours);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::Mat, 10> compute_target_ring_mask(
    const std::array<cv::RotatedRect, 10>& target_ellipses, int img_row, int img_col, bool debug = false)
{
    std::array<std::vector<cv::Point>, 10> target_contours;
    std::transform(
        target_ellipses.begin(), target_ellipses.end(), target_contours.begin(), [](const cv::RotatedRect& rect) {
            std::vector<cv::Point> result;
            cv::Size2f size(rect.size.width / 2.f, rect.size.height / 2.f);
            cv::ellipse2Poly(rect.center, size, static_cast<int>(rect.angle), 0, 360, 1, result);
            return result;
        });

    std::array<cv::Mat, 10> target_ring_mask;
    std::transform(target_contours.begin(), target_contours.end(), target_ring_mask.begin(),
        [img_row, img_col](const std::vector<cv::Point>& contours_pts) {
            cv::Mat result = cv::Mat::zeros(img_row, img_col, CV_8U);
            cv::fillConvexPoly(result, contours_pts, 255);
            return result;
        });

    // display_target_contours_masks(target_ring_mask.begin(), target_ring_mask.end());
    return target_ring_mask;
}